

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callFunctionTestSuite.cpp
# Opt level: O3

int __thiscall Test::max<int>(Test *this,int *lhs,int *rhs)

{
  int iVar1;
  iterator iVar2;
  key_type local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"max","");
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  *)this,&local_48);
  if ((_Rb_tree_header *)iVar2._M_node !=
      &(this->mVisitedMethods)._M_t._M_impl.super__Rb_tree_header) {
    iVar2._M_node[2]._M_color = iVar2._M_node[2]._M_color + _S_black;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  iVar1 = *rhs;
  if (*rhs < *lhs) {
    iVar1 = *lhs;
  }
  return iVar1;
}

Assistant:

T max(T& lhs, T& rhs)
  {
    incrementMethodVisitedCounter("max");
    return (lhs > rhs) ? lhs : rhs;
  }